

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O3

ActionResults * __thiscall GreenRoomFourAction::Look(GreenRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string information;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == KID) {
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "The child in front of you whispers repeatedly :aqua, water, ma\'an, eau, Wasser, vody...."
               ,"");
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_80,local_80 + local_78);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_40);
    _Var3._M_p = local_40._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != CLEAN_BUCKET) {
      pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "You examine the bucket of ice cool water. You see the child\'s eyes lock on the bucket"
               ,"");
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_80,local_80 + local_78);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return pAVar2;
}

Assistant:

ActionResults * GreenRoomFourAction::Look() {

    if(commands->getMainItem() == KID) {
        std::string information = "The child in front of you whispers repeatedly :"
                "aqua, water, ma'an, eau, Wasser, vody....";
        return new ActionResults(CURRENT, information);
    } else if (commands->getMainItem() == CLEAN_BUCKET) {
        std::string information = "You examine the bucket of ice cool water. You see the child's eyes lock on the bucket";
        return new ActionResults(CURRENT, information);
    } else {
        return AbstractRoomAction::Look();
    }

}